

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

NodeRef * __thiscall c4::yml::Tree::operator[](Tree *this,csubstr key)

{
  code *pcVar1;
  Location LVar2;
  Location loc;
  csubstr seed_key;
  bool bVar3;
  error_flags eVar4;
  size_t sVar5;
  size_t in_RCX;
  char (*in_RDX) [71];
  size_t in_RSI;
  NodeRef *in_RDI;
  csubstr *in_stack_00000070;
  size_t in_stack_00000078;
  Tree *in_stack_00000080;
  size_t ch;
  char msg [68];
  size_t in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  Tree *in_stack_fffffffffffffea8;
  Tree *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  Location *in_stack_fffffffffffffec0;
  undefined1 auVar6 [16];
  undefined1 auVar7 [24];
  undefined1 in_stack_ffffffffffffff00 [32];
  undefined8 local_b0;
  size_t sStack_a8;
  Tree *local_a0;
  Tree *pTStack_98;
  size_t local_90;
  char local_88 [80];
  size_t sStack_38;
  Tree *local_30;
  Tree *pTStack_28;
  char *local_20;
  undefined1 *local_18;
  char (*local_10) [71];
  size_t sStack_8;
  
  rootref(in_stack_fffffffffffffeb0);
  auVar6 = in_stack_ffffffffffffff00._0_16_;
  local_18 = &stack0xffffffffffffff00;
  local_10 = in_RDX;
  sStack_8 = in_RCX;
  if (in_stack_ffffffffffffff00._0_8_ == 0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    Location::Location((Location *)in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
                       in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    auVar6 = in_stack_ffffffffffffff00._0_16_;
    loc.name.len = in_RSI;
    auVar7 = in_stack_ffffffffffffff00._0_24_;
    loc.super_LineCol.offset = auVar7._0_8_;
    loc.super_LineCol.line = auVar7._8_8_;
    loc.super_LineCol.col = auVar7._16_8_;
    loc.name.str = (char *)in_stack_ffffffffffffff00._24_8_;
    error<71ul>(in_RDX,loc);
    in_stack_fffffffffffffea0 = sStack_38;
    in_stack_fffffffffffffea8 = local_30;
    in_stack_fffffffffffffeb0 = pTStack_28;
    in_stack_fffffffffffffeb8 = local_20;
  }
  if (auVar6._8_8_ == -1) {
    memcpy(local_88,"check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)",0x44);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(auVar6._0_8_ + 0x58);
    Location::Location(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (size_t)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8,
                       in_stack_fffffffffffffea0);
    LVar2.super_LineCol.line = sStack_a8;
    LVar2.super_LineCol.offset = local_b0;
    LVar2.super_LineCol.col = (size_t)local_a0;
    LVar2.name.str = (char *)pTStack_98;
    LVar2.name.len = local_90;
    (*pcVar1)(local_88,0x44,LVar2,*(void **)(auVar6._0_8_ + 0x40));
    in_stack_fffffffffffffea0 = sStack_a8;
    in_stack_fffffffffffffea8 = local_a0;
    in_stack_fffffffffffffeb0 = pTStack_98;
  }
  sVar5 = find_child(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  if (sVar5 == 0xffffffffffffffff) {
    seed_key.len = sStack_8;
    seed_key.str = *local_10;
    NodeRef::NodeRef(in_RDI,auVar6._0_8_,auVar6._8_8_,seed_key);
  }
  else {
    NodeRef::NodeRef((NodeRef *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     in_stack_fffffffffffffea0);
  }
  return in_RDI;
}

Assistant:

NodeRef Tree::operator[] (csubstr key)
{
    return rootref()[key];
}